

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<long_long,int>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_01;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_02;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_03;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> lhs_04;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs_01;
  int u2;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  bool b;
  longlong t;
  int u;
  undefined4 in_stack_fffffffffffffce8;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcec;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffcf8;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd00;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffd18;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar2;
  longlong local_30;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_24;
  longlong local_20;
  byte local_11;
  longlong local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0;
  local_11 = 0;
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
               (int *)CONCAT44(in_stack_fffffffffffffcec.m_int,in_stack_fffffffffffffce8));
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_24,&local_4);
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffd00.m_int,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffcf8.m_int);
  local_11 = (local_11 ^ 0xff) & 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(longlong *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
            (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *)
            CONCAT44(in_stack_fffffffffffffcec.m_int,in_stack_fffffffffffffce8));
  local_20 = local_30;
  SafeInt::operator_cast_to_int
            ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator*((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator*(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffd00.m_int,
             (int)((ulong)in_stack_fffffffffffffcf8.m_int >> 0x20));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator*=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  local_4 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator%((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
             in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator%=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  local_4 = 1;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator/((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator/(in_stack_fffffffffffffd14,in_stack_fffffffffffffd18);
  SVar2.m_int = (int)((ulong)in_stack_fffffffffffffd18.m_int >> 0x20);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
             in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator/=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator+((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator+(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
             in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator+=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  local_4 = 0;
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator-((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator-(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf8);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
             in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator-=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  local_4 = 1;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )in_stack_fffffffffffffd00.m_int,(int *)in_stack_fffffffffffffcf8.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),SVar2);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator<<(in_stack_fffffffffffffd00.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd08.m_int >> 0x20));
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
              in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator<<=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)in_stack_fffffffffffffcf8.m_int,
              (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
              (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),SVar2);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator>>(in_stack_fffffffffffffd00.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd08.m_int >> 0x20));
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
              in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator>>=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               *)in_stack_fffffffffffffcf8.m_int,
              (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
              (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator&(CONCAT44(in_stack_fffffffffffffcec.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf0);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator&=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
             in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator&=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator|(CONCAT44(in_stack_fffffffffffffcec.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf0);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator|=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
             in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator|=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffd00.m_int,in_stack_fffffffffffffd08);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffcf4);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  operator^(CONCAT44(in_stack_fffffffffffffcec.m_int,in_stack_fffffffffffffce8),
            in_stack_fffffffffffffcf0);
  local_10 = SafeInt::operator_cast_to_long_long
                       ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int));
  SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  operator^=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,in_stack_fffffffffffffd00);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0.m_int),
             in_stack_fffffffffffffcec.m_int);
  SafeInt<long_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
  operator^=((SafeInt<long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)in_stack_fffffffffffffcf8.m_int,
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)((ulong)in_stack_fffffffffffffd00.m_int >> 0x20));
  SVar2.m_int = (int)((ulong)in_stack_fffffffffffffcf8.m_int >> 0x20);
  SVar1.m_int._4_4_ = in_stack_fffffffffffffcf4;
  SVar1.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator<(SVar1,in_stack_fffffffffffffcec);
  local_11 = operator<(in_stack_fffffffffffffd00,SVar2.m_int);
  rhs.m_int._4_4_ = in_stack_fffffffffffffcf4;
  rhs.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator<(in_stack_fffffffffffffcec.m_int,rhs);
  lhs.m_int._4_4_ = in_stack_fffffffffffffcf4;
  lhs.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator<(lhs,in_stack_fffffffffffffcec);
  local_11 = operator<=(in_stack_fffffffffffffd00,SVar2);
  lhs_00.m_int._4_4_ = in_stack_fffffffffffffcf4;
  lhs_00.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator<=(lhs_00,in_stack_fffffffffffffcec.m_int);
  local_11 = operator<=(SVar2.m_int,in_stack_fffffffffffffd00);
  local_11 = operator<=(in_stack_fffffffffffffd00,SVar2);
  local_11 = operator>(in_stack_fffffffffffffd00,SVar2);
  lhs_01.m_int._4_4_ = in_stack_fffffffffffffcf4;
  lhs_01.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator>(lhs_01,in_stack_fffffffffffffcec.m_int);
  local_11 = operator>(SVar2.m_int,in_stack_fffffffffffffd00);
  local_11 = operator>(in_stack_fffffffffffffd00,SVar2);
  lhs_02.m_int._4_4_ = in_stack_fffffffffffffcf4;
  lhs_02.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator>=(lhs_02,in_stack_fffffffffffffcec);
  local_11 = operator>=(in_stack_fffffffffffffd00,SVar2.m_int);
  rhs_00.m_int._4_4_ = in_stack_fffffffffffffcf4;
  rhs_00.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator>=(in_stack_fffffffffffffcec.m_int,rhs_00);
  lhs_03.m_int._4_4_ = in_stack_fffffffffffffcf4;
  lhs_03.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator>=(lhs_03,in_stack_fffffffffffffcec);
  local_11 = operator==(in_stack_fffffffffffffd00,SVar2);
  lhs_04.m_int._4_4_ = in_stack_fffffffffffffcf4;
  lhs_04.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  local_11 = operator==(lhs_04,in_stack_fffffffffffffcec.m_int);
  rhs_01.m_int._4_4_ = in_stack_fffffffffffffcf4;
  rhs_01.m_int._0_4_ = in_stack_fffffffffffffcf0.m_int;
  SVar1.m_int = local_20;
  local_11 = operator==(in_stack_fffffffffffffcec.m_int,rhs_01);
  operator==(SVar1,(SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    )(int)((ulong)local_20 >> 0x20));
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}